

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterNextPage(Fts5Index *p,Fts5SegIter *pIter)

{
  Fts5StructureSegment *pFVar1;
  int iVar2;
  Fts5Data *pFVar3;
  Fts5StructureSegment *pSeg;
  Fts5Data *pLeaf;
  Fts5SegIter *pIter_local;
  Fts5Index *p_local;
  
  pFVar1 = pIter->pSeg;
  fts5DataRelease(pIter->pLeaf);
  pIter->iLeafPgno = pIter->iLeafPgno + 1;
  if (pIter->pNextLeaf == (Fts5Data *)0x0) {
    if (pFVar1->pgnoLast < pIter->iLeafPgno) {
      pIter->pLeaf = (Fts5Data *)0x0;
    }
    else {
      pFVar3 = fts5LeafRead(p,((long)pFVar1->iSegid << 0x25) + (long)pIter->iLeafPgno);
      pIter->pLeaf = pFVar3;
    }
  }
  else {
    pIter->pLeaf = pIter->pNextLeaf;
    pIter->pNextLeaf = (Fts5Data *)0x0;
  }
  pFVar3 = pIter->pLeaf;
  if (pFVar3 != (Fts5Data *)0x0) {
    pIter->iPgidxOff = pFVar3->szLeaf;
    if (pFVar3->szLeaf < pFVar3->nn) {
      iVar2 = sqlite3Fts5GetVarint32(pFVar3->p + pIter->iPgidxOff,(u32 *)&pIter->iEndofDoclist);
      pIter->iPgidxOff = iVar2 + pIter->iPgidxOff;
    }
    else {
      pIter->iEndofDoclist = pFVar3->nn + 1;
    }
  }
  return;
}

Assistant:

static void fts5SegIterNextPage(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter              /* Iterator to advance to next page */
){
  Fts5Data *pLeaf;
  Fts5StructureSegment *pSeg = pIter->pSeg;
  fts5DataRelease(pIter->pLeaf);
  pIter->iLeafPgno++;
  if( pIter->pNextLeaf ){
    pIter->pLeaf = pIter->pNextLeaf;
    pIter->pNextLeaf = 0;
  }else if( pIter->iLeafPgno<=pSeg->pgnoLast ){
    pIter->pLeaf = fts5LeafRead(p, 
        FTS5_SEGMENT_ROWID(pSeg->iSegid, pIter->iLeafPgno)
    );
  }else{
    pIter->pLeaf = 0;
  }
  pLeaf = pIter->pLeaf;

  if( pLeaf ){
    pIter->iPgidxOff = pLeaf->szLeaf;
    if( fts5LeafIsTermless(pLeaf) ){
      pIter->iEndofDoclist = pLeaf->nn+1;
    }else{
      pIter->iPgidxOff += fts5GetVarint32(&pLeaf->p[pIter->iPgidxOff],
          pIter->iEndofDoclist
      );
    }
  }
}